

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O2

void rsg::(anonymous_namespace)::computeEqualityValueRange<true,bool>
               (Random *rnd,bool dstMin,bool dstMax,bool *aMin,bool *aMax,bool *bMin,bool *bMax)

{
  bool bVar1;
  bool bVar2;
  
  if (dstMax && !dstMin) {
    *aMin = false;
    *aMax = true;
    bVar2 = true;
    bVar1 = false;
  }
  else {
    bVar1 = de::Random::getBool(rnd);
    *aMin = bVar1;
    *aMax = bVar1;
    bVar2 = bVar1;
    if (!dstMin) {
      bVar1 = !bVar1;
      bVar2 = bVar1;
    }
  }
  *bMin = bVar1;
  *bMax = bVar2;
  return;
}

Assistant:

void computeEqualityValueRange<true, bool> (de::Random& rnd, bool dstMin, bool dstMax, bool& aMin, bool& aMax, bool& bMin, bool& bMax)
{
	if (dstMin == false && dstMax == true)
	{
		aMin	= false;
		aMax	= true;
		bMin	= false;
		bMax	= true;
	}
	else if (dstMin == false)
	{
		DE_ASSERT(dstMax == false);
		bool val = rnd.getBool();

		aMin	= val;
		aMax	= val;
		bMin	= !val;
		bMax	= !val;
	}
	else
	{
		DE_ASSERT(dstMin == true && dstMax == true);
		bool val = rnd.getBool();

		aMin	= val;
		aMax	= val;
		bMin	= val;
		bMax	= val;
	}
}